

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O0

void __thiscall lf::assemble::UniformFEDofHandler::InitTotalNumDofs(UniformFEDofHandler *this)

{
  value_type_conflict1 vVar1;
  size_type sVar2;
  size_type sVar3;
  uint uVar4;
  reference pvVar5;
  uint *puVar6;
  UniformFEDofHandler *this_local;
  
  vVar1 = this->num_loc_dof_point_;
  pvVar5 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kNodeOrd);
  *pvVar5 = vVar1;
  sVar2 = this->num_loc_dof_point_;
  sVar3 = this->num_loc_dof_segment_;
  pvVar5 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kEdgeOrd);
  *pvVar5 = sVar2 * 2 + sVar3;
  this->num_dofs_tria_ =
       this->num_loc_dof_point_ * 3 + this->num_loc_dof_segment_ * 3 + this->num_loc_dof_tria_;
  this->num_dofs_quad_ =
       this->num_loc_dof_point_ * 4 + this->num_loc_dof_segment_ * 4 + this->num_loc_dof_quad_;
  puVar6 = std::max<unsigned_int>(&this->num_dofs_tria_,&this->num_dofs_quad_);
  uVar4 = *puVar6;
  pvVar5 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kCellOrd);
  *pvVar5 = uVar4;
  return;
}

Assistant:

void UniformFEDofHandler::InitTotalNumDofs() {
  num_dofs_[kNodeOrd] = num_loc_dof_point_;
  num_dofs_[kEdgeOrd] = 2 * num_loc_dof_point_ + num_loc_dof_segment_;
  num_dofs_tria_ =
      3 * num_loc_dof_point_ + 3 * num_loc_dof_segment_ + num_loc_dof_tria_;
  num_dofs_quad_ =
      4 * num_loc_dof_point_ + 4 * num_loc_dof_segment_ + num_loc_dof_quad_;
  num_dofs_[kCellOrd] = std::max(num_dofs_tria_, num_dofs_quad_);
}